

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo
          (ImmutableMessageOneofFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  FieldDescriptor *pFVar1;
  uint32_t number;
  long lVar2;
  
  WriteUInt32ToUtf16CharSequence
            (*(uint32_t *)((this->super_ImmutableMessageFieldLiteGenerator).descriptor_ + 4),output)
  ;
  number = GetExperimentalJavaFieldType
                     ((this->super_ImmutableMessageFieldLiteGenerator).descriptor_);
  WriteUInt32ToUtf16CharSequence(number,output);
  pFVar1 = (this->super_ImmutableMessageFieldLiteGenerator).descriptor_;
  if (((byte)pFVar1[1] & 0x10) == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)(pFVar1 + 0x28);
  }
  WriteUInt32ToUtf16CharSequence
            ((int)((ulong)(lVar2 - *(long *)(*(long *)(lVar2 + 0x10) + 0x30)) >> 3) * -0x33333333,
             output);
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldLiteGenerator).variables_,
                     "$oneof_stored_type$.class,\n");
  return;
}

Assistant:

void ImmutableMessageOneofFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16_t>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  WriteIntToUtf16CharSequence(descriptor_->containing_oneof()->index(), output);
  printer->Print(variables_, "$oneof_stored_type$.class,\n");
}